

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_hd.c
# Opt level: O2

size_t encode_length(uint8_t *buf,size_t n,size_t prefix)

{
  ulong uVar1;
  uint uVar2;
  byte bVar3;
  uint uVar4;
  
  uVar4 = -1 << ((byte)prefix & 0x1f);
  uVar2 = ~uVar4;
  bVar3 = (byte)uVar4 & *buf;
  uVar1 = n - uVar2;
  if (n < uVar2) {
    *buf = bVar3 | (byte)n;
    return uVar1;
  }
  *buf = bVar3 | (byte)uVar2;
  for (; buf = buf + 1, 0x7f < uVar1; uVar1 = uVar1 >> 7) {
    *buf = (byte)uVar1 | 0x80;
  }
  *buf = (byte)uVar1;
  return uVar1;
}

Assistant:

static size_t encode_length(uint8_t *buf, size_t n, size_t prefix) {
  size_t k = (size_t)((1 << prefix) - 1);
  uint8_t *begin = buf;

  *buf = (uint8_t)(*buf & ~k);

  if (n < k) {
    *buf = (uint8_t)(*buf | n);
    return 1;
  }

  *buf = (uint8_t)(*buf | k);
  ++buf;

  n -= k;

  for (; n >= 128; n >>= 7) {
    *buf++ = (uint8_t)((1 << 7) | (n & 0x7f));
  }

  *buf++ = (uint8_t)n;

  return (size_t)(buf - begin);
}